

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlFatalErr(xmlParserCtxtPtr ctxt,xmlParserErrors error,char *info)

{
  char *local_38;
  char *errmsg;
  char *info_local;
  xmlParserErrors error_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (((ctxt == (xmlParserCtxtPtr)0x0) || (ctxt->disableSAX == 0)) ||
     (ctxt->instate != XML_PARSER_EOF)) {
    switch(error) {
    case XML_ERR_INTERNAL_ERROR:
      local_38 = "internal error";
      break;
    default:
      local_38 = "Unregistered error message";
      break;
    case XML_ERR_DOCUMENT_EMPTY:
      local_38 = "Document is empty";
      break;
    case XML_ERR_DOCUMENT_END:
      local_38 = "Extra content at the end of the document";
      break;
    case XML_ERR_INVALID_HEX_CHARREF:
      local_38 = "CharRef: invalid hexadecimal value";
      break;
    case XML_ERR_INVALID_DEC_CHARREF:
      local_38 = "CharRef: invalid decimal value";
      break;
    case XML_ERR_INVALID_CHARREF:
      local_38 = "CharRef: invalid value";
      break;
    case XML_ERR_PEREF_AT_EOF:
      local_38 = "PEReference at end of document";
      break;
    case XML_ERR_PEREF_IN_PROLOG:
      local_38 = "PEReference in prolog";
      break;
    case XML_ERR_PEREF_IN_EPILOG:
      local_38 = "PEReference in epilog";
      break;
    case XML_ERR_PEREF_IN_INT_SUBSET:
      local_38 = "PEReference: forbidden within markup decl in internal subset";
      break;
    case XML_ERR_ENTITYREF_SEMICOL_MISSING:
      local_38 = "EntityRef: expecting \';\'";
      break;
    case XML_ERR_PEREF_NO_NAME:
      local_38 = "PEReference: no name";
      break;
    case XML_ERR_PEREF_SEMICOL_MISSING:
      local_38 = "PEReference: expecting \';\'";
      break;
    case XML_ERR_STRING_NOT_STARTED:
      local_38 = "String not started expecting \' or \"";
      break;
    case XML_ERR_STRING_NOT_CLOSED:
      local_38 = "String not closed expecting \" or \'";
      break;
    case XML_ERR_ENTITY_NOT_STARTED:
      local_38 = "EntityValue: \" or \' expected";
      break;
    case XML_ERR_ENTITY_NOT_FINISHED:
      local_38 = "EntityValue: \" or \' expected";
      break;
    case XML_ERR_LT_IN_ATTRIBUTE:
      local_38 = "Unescaped \'<\' not allowed in attributes values";
      break;
    case XML_ERR_ATTRIBUTE_NOT_STARTED:
      local_38 = "AttValue: \" or \' expected";
      break;
    case XML_ERR_LITERAL_NOT_STARTED:
      local_38 = "SystemLiteral \" or \' expected";
      break;
    case XML_ERR_LITERAL_NOT_FINISHED:
      local_38 = "Unfinished System or Public ID \" or \' expected";
      break;
    case XML_ERR_PI_NOT_STARTED:
      local_38 = "xmlParsePI : no target name";
      break;
    case XML_ERR_NOTATION_NOT_STARTED:
      local_38 = "NOTATION: Name expected here";
      break;
    case XML_ERR_NOTATION_NOT_FINISHED:
      local_38 = "\'>\' required to close NOTATION declaration";
      break;
    case XML_ERR_ATTLIST_NOT_STARTED:
      local_38 = "\'(\' required to start ATTLIST enumeration";
      break;
    case XML_ERR_ATTLIST_NOT_FINISHED:
      local_38 = "\')\' required to finish ATTLIST enumeration";
      break;
    case XML_ERR_MIXED_NOT_STARTED:
      local_38 = "MixedContentDecl : \'|\' or \')*\' expected";
      break;
    case XML_ERR_ELEMCONTENT_NOT_STARTED:
      local_38 = "ContentDecl : Name or \'(\' expected";
      break;
    case XML_ERR_ELEMCONTENT_NOT_FINISHED:
      local_38 = "ContentDecl : \',\' \'|\' or \')\' expected";
      break;
    case XML_ERR_XMLDECL_NOT_STARTED:
      local_38 = "Text declaration \'<?xml\' required";
      break;
    case XML_ERR_XMLDECL_NOT_FINISHED:
      local_38 = "parsing XML declaration: \'?>\' expected";
      break;
    case XML_ERR_CONDSEC_NOT_FINISHED:
      local_38 = "XML conditional section not closed";
      break;
    case XML_ERR_EXT_SUBSET_NOT_FINISHED:
      local_38 = "Content error in the external subset";
      break;
    case XML_ERR_DOCTYPE_NOT_FINISHED:
      local_38 = "DOCTYPE improperly terminated";
      break;
    case XML_ERR_MISPLACED_CDATA_END:
      local_38 = "Sequence \']]>\' not allowed in content";
      break;
    case XML_ERR_RESERVED_XML_NAME:
      local_38 = "Invalid PI name";
      break;
    case XML_ERR_NMTOKEN_REQUIRED:
      local_38 = "NmToken expected in ATTLIST enumeration";
      break;
    case XML_ERR_PCDATA_REQUIRED:
      local_38 = "MixedContentDecl : \'#PCDATA\' expected";
      break;
    case XML_ERR_URI_REQUIRED:
      local_38 = "SYSTEM or PUBLIC, the URI is missing";
      break;
    case XML_ERR_PUBID_REQUIRED:
      local_38 = "PUBLIC, the Public Identifier is missing";
      break;
    case XML_ERR_GT_REQUIRED:
      local_38 = "expected \'>\'";
      break;
    case XML_ERR_LTSLASH_REQUIRED:
      local_38 = "EndTag: \'</\' not found";
      break;
    case XML_ERR_EQUAL_REQUIRED:
      local_38 = "expected \'=\'";
      break;
    case XML_ERR_STANDALONE_VALUE:
      local_38 = "standalone accepts only \'yes\' or \'no\'";
      break;
    case XML_ERR_ENCODING_NAME:
      local_38 = "Invalid XML encoding name";
      break;
    case XML_ERR_HYPHEN_IN_COMMENT:
      local_38 = "Comment must not contain \'--\' (double-hyphen)";
      break;
    case XML_ERR_EXT_ENTITY_STANDALONE:
      local_38 = "external parsed entities cannot be standalone";
      break;
    case XML_ERR_CONDSEC_INVALID:
      local_38 = "XML conditional section \'[\' expected";
      break;
    case XML_ERR_VALUE_REQUIRED:
      local_38 = "Entity value required";
      break;
    case XML_ERR_NOT_WELL_BALANCED:
      local_38 = "chunk is not well balanced";
      break;
    case XML_ERR_EXTRA_CONTENT:
      local_38 = "extra content at the end of well balanced chunk";
      break;
    case XML_ERR_ENTITY_PE_INTERNAL:
      local_38 = "PEReferences forbidden in internal subset";
      break;
    case XML_ERR_ENTITY_LOOP:
      local_38 = "Detected an entity reference loop";
      break;
    case XML_ERR_URI_FRAGMENT:
      local_38 = "Fragment not allowed";
      break;
    case XML_ERR_CONDSEC_INVALID_KEYWORD:
      local_38 = "conditional section INCLUDE or IGNORE keyword expected";
      break;
    case XML_ERR_VERSION_MISSING:
      local_38 = "Malformed declaration expecting version";
      break;
    case XML_ERR_NAME_TOO_LONG:
      local_38 = "Name too long";
    }
    if (ctxt != (xmlParserCtxtPtr)0x0) {
      ctxt->errNo = error;
    }
    if (info == (char *)0x0) {
      __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,ctxt,
                      (void *)0x0,1,error,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                      (char *)0x0,0,0,"%s\n",local_38);
    }
    else {
      __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,ctxt,
                      (void *)0x0,1,error,XML_ERR_FATAL,(char *)0x0,0,info,(char *)0x0,(char *)0x0,0
                      ,0,"%s: %s\n",local_38,info);
    }
    if ((ctxt != (xmlParserCtxtPtr)0x0) && (ctxt->wellFormed = 0, ctxt->recovery == 0)) {
      ctxt->disableSAX = 1;
    }
  }
  return;
}

Assistant:

static void
xmlFatalErr(xmlParserCtxtPtr ctxt, xmlParserErrors error, const char *info)
{
    const char *errmsg;

    if ((ctxt != NULL) && (ctxt->disableSAX != 0) &&
        (ctxt->instate == XML_PARSER_EOF))
	return;
    switch (error) {
        case XML_ERR_INVALID_HEX_CHARREF:
            errmsg = "CharRef: invalid hexadecimal value";
            break;
        case XML_ERR_INVALID_DEC_CHARREF:
            errmsg = "CharRef: invalid decimal value";
            break;
        case XML_ERR_INVALID_CHARREF:
            errmsg = "CharRef: invalid value";
            break;
        case XML_ERR_INTERNAL_ERROR:
            errmsg = "internal error";
            break;
        case XML_ERR_PEREF_AT_EOF:
            errmsg = "PEReference at end of document";
            break;
        case XML_ERR_PEREF_IN_PROLOG:
            errmsg = "PEReference in prolog";
            break;
        case XML_ERR_PEREF_IN_EPILOG:
            errmsg = "PEReference in epilog";
            break;
        case XML_ERR_PEREF_NO_NAME:
            errmsg = "PEReference: no name";
            break;
        case XML_ERR_PEREF_SEMICOL_MISSING:
            errmsg = "PEReference: expecting ';'";
            break;
        case XML_ERR_ENTITY_LOOP:
            errmsg = "Detected an entity reference loop";
            break;
        case XML_ERR_ENTITY_NOT_STARTED:
            errmsg = "EntityValue: \" or ' expected";
            break;
        case XML_ERR_ENTITY_PE_INTERNAL:
            errmsg = "PEReferences forbidden in internal subset";
            break;
        case XML_ERR_ENTITY_NOT_FINISHED:
            errmsg = "EntityValue: \" or ' expected";
            break;
        case XML_ERR_ATTRIBUTE_NOT_STARTED:
            errmsg = "AttValue: \" or ' expected";
            break;
        case XML_ERR_LT_IN_ATTRIBUTE:
            errmsg = "Unescaped '<' not allowed in attributes values";
            break;
        case XML_ERR_LITERAL_NOT_STARTED:
            errmsg = "SystemLiteral \" or ' expected";
            break;
        case XML_ERR_LITERAL_NOT_FINISHED:
            errmsg = "Unfinished System or Public ID \" or ' expected";
            break;
        case XML_ERR_MISPLACED_CDATA_END:
            errmsg = "Sequence ']]>' not allowed in content";
            break;
        case XML_ERR_URI_REQUIRED:
            errmsg = "SYSTEM or PUBLIC, the URI is missing";
            break;
        case XML_ERR_PUBID_REQUIRED:
            errmsg = "PUBLIC, the Public Identifier is missing";
            break;
        case XML_ERR_HYPHEN_IN_COMMENT:
            errmsg = "Comment must not contain '--' (double-hyphen)";
            break;
        case XML_ERR_PI_NOT_STARTED:
            errmsg = "xmlParsePI : no target name";
            break;
        case XML_ERR_RESERVED_XML_NAME:
            errmsg = "Invalid PI name";
            break;
        case XML_ERR_NOTATION_NOT_STARTED:
            errmsg = "NOTATION: Name expected here";
            break;
        case XML_ERR_NOTATION_NOT_FINISHED:
            errmsg = "'>' required to close NOTATION declaration";
            break;
        case XML_ERR_VALUE_REQUIRED:
            errmsg = "Entity value required";
            break;
        case XML_ERR_URI_FRAGMENT:
            errmsg = "Fragment not allowed";
            break;
        case XML_ERR_ATTLIST_NOT_STARTED:
            errmsg = "'(' required to start ATTLIST enumeration";
            break;
        case XML_ERR_NMTOKEN_REQUIRED:
            errmsg = "NmToken expected in ATTLIST enumeration";
            break;
        case XML_ERR_ATTLIST_NOT_FINISHED:
            errmsg = "')' required to finish ATTLIST enumeration";
            break;
        case XML_ERR_MIXED_NOT_STARTED:
            errmsg = "MixedContentDecl : '|' or ')*' expected";
            break;
        case XML_ERR_PCDATA_REQUIRED:
            errmsg = "MixedContentDecl : '#PCDATA' expected";
            break;
        case XML_ERR_ELEMCONTENT_NOT_STARTED:
            errmsg = "ContentDecl : Name or '(' expected";
            break;
        case XML_ERR_ELEMCONTENT_NOT_FINISHED:
            errmsg = "ContentDecl : ',' '|' or ')' expected";
            break;
        case XML_ERR_PEREF_IN_INT_SUBSET:
            errmsg =
                "PEReference: forbidden within markup decl in internal subset";
            break;
        case XML_ERR_GT_REQUIRED:
            errmsg = "expected '>'";
            break;
        case XML_ERR_CONDSEC_INVALID:
            errmsg = "XML conditional section '[' expected";
            break;
        case XML_ERR_EXT_SUBSET_NOT_FINISHED:
            errmsg = "Content error in the external subset";
            break;
        case XML_ERR_CONDSEC_INVALID_KEYWORD:
            errmsg =
                "conditional section INCLUDE or IGNORE keyword expected";
            break;
        case XML_ERR_CONDSEC_NOT_FINISHED:
            errmsg = "XML conditional section not closed";
            break;
        case XML_ERR_XMLDECL_NOT_STARTED:
            errmsg = "Text declaration '<?xml' required";
            break;
        case XML_ERR_XMLDECL_NOT_FINISHED:
            errmsg = "parsing XML declaration: '?>' expected";
            break;
        case XML_ERR_EXT_ENTITY_STANDALONE:
            errmsg = "external parsed entities cannot be standalone";
            break;
        case XML_ERR_ENTITYREF_SEMICOL_MISSING:
            errmsg = "EntityRef: expecting ';'";
            break;
        case XML_ERR_DOCTYPE_NOT_FINISHED:
            errmsg = "DOCTYPE improperly terminated";
            break;
        case XML_ERR_LTSLASH_REQUIRED:
            errmsg = "EndTag: '</' not found";
            break;
        case XML_ERR_EQUAL_REQUIRED:
            errmsg = "expected '='";
            break;
        case XML_ERR_STRING_NOT_CLOSED:
            errmsg = "String not closed expecting \" or '";
            break;
        case XML_ERR_STRING_NOT_STARTED:
            errmsg = "String not started expecting ' or \"";
            break;
        case XML_ERR_ENCODING_NAME:
            errmsg = "Invalid XML encoding name";
            break;
        case XML_ERR_STANDALONE_VALUE:
            errmsg = "standalone accepts only 'yes' or 'no'";
            break;
        case XML_ERR_DOCUMENT_EMPTY:
            errmsg = "Document is empty";
            break;
        case XML_ERR_DOCUMENT_END:
            errmsg = "Extra content at the end of the document";
            break;
        case XML_ERR_NOT_WELL_BALANCED:
            errmsg = "chunk is not well balanced";
            break;
        case XML_ERR_EXTRA_CONTENT:
            errmsg = "extra content at the end of well balanced chunk";
            break;
        case XML_ERR_VERSION_MISSING:
            errmsg = "Malformed declaration expecting version";
            break;
        case XML_ERR_NAME_TOO_LONG:
            errmsg = "Name too long";
            break;
#if 0
        case:
            errmsg = "";
            break;
#endif
        default:
            errmsg = "Unregistered error message";
    }
    if (ctxt != NULL)
	ctxt->errNo = error;
    if (info == NULL) {
        __xmlRaiseError(NULL, NULL, NULL, ctxt, NULL, XML_FROM_PARSER, error,
                        XML_ERR_FATAL, NULL, 0, info, NULL, NULL, 0, 0, "%s\n",
                        errmsg);
    } else {
        __xmlRaiseError(NULL, NULL, NULL, ctxt, NULL, XML_FROM_PARSER, error,
                        XML_ERR_FATAL, NULL, 0, info, NULL, NULL, 0, 0, "%s: %s\n",
                        errmsg, info);
    }
    if (ctxt != NULL) {
	ctxt->wellFormed = 0;
	if (ctxt->recovery == 0)
	    ctxt->disableSAX = 1;
    }
}